

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_FuncCheckMajority(Gem_Man_t *p,int f)

{
  Vec_Mem_t *pVVar1;
  Gem_Obj_t *pGVar2;
  uint uVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  int Polar;
  uint local_1c;
  
  if ((f < 0) || (pVVar1 = p->vTtMem, pVVar1->nEntries <= f)) {
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  }
  pGVar2 = p->pObjs;
  uVar3 = *(uint *)(pGVar2 + f) & 0xf;
  uVar6 = 0;
  local_1c = 0;
  uVar7 = 0;
  while( true ) {
    bVar9 = (pVVar1->ppPages[(uint)f >> ((byte)pVVar1->LogPageSze & 0x1f)]
             [(long)(f & pVVar1->PageMask) * (long)pVVar1->nEntrySize + (uVar7 >> 6)] >>
             (uVar7 & 0x3f) & 1) != 0;
    uVar5 = 0;
    if (uVar3 != 0) {
      uVar5 = 0;
      uVar8 = 0;
      do {
        uVar5 = uVar5 + (((uint)uVar7 >> (uVar8 & 0x1f) & 1) != 0);
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar8 = 1 << ((byte)uVar5 & 0x1f);
    if ((uVar6 >> (uVar5 & 0x1f) & 1) == 0) {
      uVar6 = uVar6 | uVar8;
      if (!bVar9) {
        uVar8 = 0;
      }
      local_1c = local_1c | uVar8;
      bVar9 = true;
    }
    else {
      bVar9 = bVar9 == ((local_1c >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (!bVar9) break;
    uVar5 = (uint)uVar7 + 1;
    uVar7 = (ulong)uVar5;
    if (uVar5 >> (sbyte)uVar3 != 0) {
LAB_0048ca7f:
      if (local_1c != 0xffffffff) {
        uVar3 = *(uint *)(pGVar2 + f);
        printf("Found symmetric %d-variable function: ",(ulong)(uVar3 & 0xf));
        Extra_PrintBinary2(_stdout,&local_1c,(*(uint *)(pGVar2 + f) & 0xf) + 1);
        printf("   ");
        if (((*(uint *)(pGVar2 + f) & 1) == 0) ||
           (sVar4 = (sbyte)((uVar3 & 0xf) + 1 >> 1),
           local_1c != (int)(0xffffffffffffffff >> (-sVar4 & 0x3fU)) << sVar4)) {
          putchar(10);
        }
        else {
          printf("This is majority-%d.\n",(ulong)(*(uint *)(pGVar2 + f) & 0xf));
        }
      }
      return 0;
    }
  }
  local_1c = 0xffffffff;
  goto LAB_0048ca7f;
}

Assistant:

int Gem_FuncCheckMajority( Gem_Man_t * p, int f )
{
    Gem_Obj_t * pObj = p->pObjs + f;
    word * pTruth = Vec_MemReadEntry( p->vTtMem, f );
    int Polar = Abc_TtIsFullySymmetric( pTruth, pObj->nVars );
    if ( Polar != -1 )
    {
        int nHalfVars = (pObj->nVars+1) >> 1;
        int Mask = Abc_Tt6Mask( nHalfVars );
        printf( "Found symmetric %d-variable function: ", pObj->nVars );
        Extra_PrintBinary2( stdout, (unsigned *)&Polar, pObj->nVars + 1 );
        printf( "   " );
        if ( (pObj->nVars & 1) && Polar == (Mask << nHalfVars) )
        {
            printf( "This is majority-%d.\n", pObj->nVars );
            return 0;
        }
        printf( "\n" );
    }
    return 0;
}